

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.cc
# Opt level: O2

size_type __thiscall wabt::string_view::find_first_of(string_view *this,string_view s,size_type pos)

{
  ulong uVar1;
  char *pcVar2;
  size_type sVar3;
  
  uVar1 = this->size_;
  if (uVar1 < pos) {
    pos = uVar1;
  }
  pcVar2 = std::find_first_of<char_const*,char_const*>
                     (this->data_ + pos,this->data_ + uVar1,s.data_,s.data_ + s.size_);
  sVar3 = 0xffffffffffffffff;
  if (pcVar2 != this->data_ + this->size_) {
    sVar3 = (long)pcVar2 - (long)this->data_;
  }
  return sVar3;
}

Assistant:

string_view::size_type string_view::find_first_of(string_view s,
                                                  size_type pos) const
    noexcept {
  pos = std::min(pos, size_);
  const_iterator iter =
      std::find_first_of(begin() + pos, end(), s.begin(), s.end());
  return iter == end() ? npos : iter - begin();
}